

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O3

bool __thiscall
ON_Layer::UpdateReferencedComponents
          (ON_Layer *this,ON_ComponentManifest *source_manifest,
          ON_ComponentManifest *destination_manifest,ON_ManifestMap *manifest_map)

{
  uint uVar1;
  ON_UUID manifest_item_id_00;
  bool bVar2;
  bool bVar3;
  ON_UUID *pOVar4;
  ON_ComponentManifestItem *this_00;
  ON_UUID_struct *pOVar5;
  int destination_material_index;
  ON_UUID manifest_item_id;
  ON_UUID_struct local_58;
  ON_UUID_struct local_48;
  ON_UUID local_38;
  
  if (this->m_material_index < 0) {
    bVar2 = true;
  }
  else {
    pOVar5 = &local_48;
    local_48.Data1 = 0x80000001;
    bVar2 = ON_ManifestMap::GetAndValidateDestinationIndex
                      (manifest_map,Material,this->m_material_index,destination_manifest,
                       (int *)pOVar5);
    if (!bVar2) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_layer.cpp"
                 ,0x6a,"","Unable to update render material reference.");
      pOVar5 = (ON_UUID_struct *)&Default.m_material_index;
    }
    uVar1 = pOVar5->Data1;
    if (this->m_material_index != uVar1) {
      ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
    }
    this->m_material_index = uVar1;
  }
  if (-1 < this->m_linetype_index) {
    pOVar5 = &local_48;
    local_48.Data1 = 0x80000001;
    bVar3 = ON_ManifestMap::GetAndValidateDestinationIndex
                      (manifest_map,LinePattern,this->m_linetype_index,destination_manifest,
                       (int *)pOVar5);
    if (!bVar3) {
      bVar2 = false;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_layer.cpp"
                 ,0x80,"","Unable to update line pattern reference.");
      pOVar5 = (ON_UUID_struct *)&Default.m_linetype_index;
    }
    uVar1 = pOVar5->Data1;
    if (this->m_linetype_index != uVar1) {
      ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
      this->m_linetype_index = uVar1;
    }
  }
  pOVar4 = ON_ModelComponent::ParentId(&this->super_ON_ModelComponent);
  local_58.Data1 = pOVar4->Data1;
  local_58.Data2 = pOVar4->Data2;
  local_58.Data3 = pOVar4->Data3;
  local_58.Data4 = *&pOVar4->Data4;
  bVar3 = ::operator!=(&ON_nil_uuid,&local_58);
  if (bVar3) {
    manifest_item_id_00.Data4[0] = local_58.Data4[0];
    manifest_item_id_00.Data4[1] = local_58.Data4[1];
    manifest_item_id_00.Data4[2] = local_58.Data4[2];
    manifest_item_id_00.Data4[3] = local_58.Data4[3];
    manifest_item_id_00.Data4[4] = local_58.Data4[4];
    manifest_item_id_00.Data4[5] = local_58.Data4[5];
    manifest_item_id_00.Data4[6] = local_58.Data4[6];
    manifest_item_id_00.Data4[7] = local_58.Data4[7];
    manifest_item_id_00.Data1 = local_58.Data1;
    manifest_item_id_00.Data2 = local_58.Data2;
    manifest_item_id_00.Data3 = local_58.Data3;
    this_00 = ON_ComponentManifest::ItemFromId(destination_manifest,Layer,manifest_item_id_00);
    local_38 = ON_ComponentManifestItem::Id(this_00);
    bVar3 = ::operator==(&ON_nil_uuid,&local_38);
    if (bVar3) {
      bVar2 = false;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_layer.cpp"
                 ,0x91,"","Unable to update parent layer id reference.");
      pOVar4 = ON_ModelComponent::ParentId(&Default.super_ON_ModelComponent);
      local_58.Data1 = pOVar4->Data1;
      local_58.Data2 = pOVar4->Data2;
      local_58.Data3 = pOVar4->Data3;
      local_58.Data4 = *&pOVar4->Data4;
    }
    else {
      local_58.Data4 = local_38.Data4;
      local_58._0_8_ = local_38._0_8_;
    }
    local_48._0_8_ = local_58._0_8_;
    local_48.Data4 = local_58.Data4;
    ON_ModelComponent::SetParentId(&this->super_ON_ModelComponent,&local_48);
  }
  return bVar2;
}

Assistant:

bool ON_Layer::UpdateReferencedComponents(
  const class ON_ComponentManifest& source_manifest,
  const class ON_ComponentManifest& destination_manifest,
  const class ON_ManifestMap& manifest_map
  )
{
  bool rc = true;

  // Update render material reference
  int material_index = RenderMaterialIndex();
  if (material_index >= 0)
  {
    int destination_material_index = ON_UNSET_INT_INDEX;
    if (manifest_map.GetAndValidateDestinationIndex(
      ON_ModelComponent::Type::RenderMaterial,
      material_index,
      destination_manifest,
      &destination_material_index))
    {
      material_index = destination_material_index;
    }
    else
    {
      ON_ERROR("Unable to update render material reference.");
      rc = false;
      material_index = ON_Layer::Default.RenderMaterialIndex();
    }
    SetRenderMaterialIndex(material_index);
  }

  // Update line pattern reference
  int line_pattern_index = LinetypeIndex();
  if (line_pattern_index >= 0)
  {
    int destination_line_pattern_index = ON_UNSET_INT_INDEX;
    if (manifest_map.GetAndValidateDestinationIndex(
      ON_ModelComponent::Type::LinePattern,
      line_pattern_index,
      destination_manifest,
      &destination_line_pattern_index))
    {
      line_pattern_index = destination_line_pattern_index;
    }
    else
    {
      ON_ERROR("Unable to update line pattern reference.");
      rc = false;
      line_pattern_index = ON_Layer::Default.LinetypeIndex();
    }
    SetLinetypeIndex(line_pattern_index);
  }

  // Update parent layer reference
  ON_UUID parent_layer_id = ParentLayerId();
  if (ON_nil_uuid != parent_layer_id)
  {
    const ON_UUID manifest_item_id = destination_manifest.ItemFromId(
      ON_ModelComponent::Type::Layer,
      parent_layer_id
      ).Id();
    if ( ON_nil_uuid == manifest_item_id )
    {
      ON_ERROR("Unable to update parent layer id reference.");
      rc = false;
      parent_layer_id = ON_Layer::Default.ParentLayerId();
    }
    else
    {
      parent_layer_id = manifest_item_id;
    }
    SetParentLayerId(parent_layer_id);
  }

  return rc;
}